

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStaticEnumerator.cpp
# Opt level: O1

bool __thiscall
Js::JavascriptStaticEnumerator::Initialize
          (JavascriptStaticEnumerator *this,JavascriptEnumerator *prefixEnumerator,
          ArrayObject *arrayToEnumerate,DynamicObject *objectToEnumerate,EnumeratorFlags flags,
          ScriptContext *requestContext,EnumeratorCache *enumeratorCache)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  JavascriptEnumerator *pJVar3;
  
  Memory::Recycler::WBSetBit((char *)&this->prefixEnumerator);
  (this->prefixEnumerator).ptr = prefixEnumerator;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->prefixEnumerator);
  if (arrayToEnumerate == (ArrayObject *)0x0) {
    pJVar3 = (JavascriptEnumerator *)0x0;
  }
  else {
    iVar2 = (*(arrayToEnumerate->super_DynamicObject).super_RecyclableObject.super_FinalizableObject
              .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6f])
                      (arrayToEnumerate,(ulong)flags,requestContext);
    pJVar3 = (JavascriptEnumerator *)CONCAT44(extraout_var,iVar2);
  }
  Memory::Recycler::WBSetBit((char *)&this->arrayEnumerator);
  (this->arrayEnumerator).ptr = pJVar3;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->arrayEnumerator);
  if (prefixEnumerator == (JavascriptEnumerator *)0x0) {
    prefixEnumerator = (this->arrayEnumerator).ptr;
  }
  Memory::Recycler::WBSetBit((char *)&this->currentEnumerator);
  (this->currentEnumerator).ptr = prefixEnumerator;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->currentEnumerator);
  bVar1 = DynamicObjectPropertyEnumerator::Initialize
                    (&this->propertyEnumerator,objectToEnumerate,flags,requestContext,
                     enumeratorCache);
  return bVar1;
}

Assistant:

bool JavascriptStaticEnumerator::Initialize(JavascriptEnumerator * prefixEnumerator, ArrayObject * arrayToEnumerate,
        DynamicObject * objectToEnumerate, EnumeratorFlags flags, ScriptContext * requestContext, EnumeratorCache * enumeratorCache)
    {
        this->prefixEnumerator = prefixEnumerator;
        this->arrayEnumerator = arrayToEnumerate ? arrayToEnumerate->GetIndexEnumerator(flags, requestContext) : nullptr;
        this->currentEnumerator = prefixEnumerator ? prefixEnumerator : PointerValue(arrayEnumerator);
        return this->propertyEnumerator.Initialize(objectToEnumerate, flags, requestContext, enumeratorCache);
    }